

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

EndpointDeclaration * __thiscall
soul::PoolAllocator::allocate<soul::AST::EndpointDeclaration,soul::AST::Context,bool&>
          (PoolAllocator *this,Context *args,bool *args_1)

{
  bool bVar1;
  SourceCodeText *pSVar2;
  PoolItem *pPVar3;
  
  pPVar3 = allocateSpaceForObject(this,0x78);
  bVar1 = *args_1;
  pPVar3->item = &PTR__ASTObject_002d4778;
  *(undefined4 *)&pPVar3->field_0x18 = 8;
  pSVar2 = (args->location).sourceCode.object;
  pPVar3[1].size = (size_t)pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pPVar3[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar3[1].item = args->parentScope;
  pPVar3->item = &PTR__EndpointDeclaration_002d5dc0;
  pPVar3[1].field_0x18 = bVar1;
  pPVar3[2].size = 0;
  pPVar3[2].destructor = (DestructorFn *)0x0;
  pPVar3[2].item = (void *)0x0;
  *(undefined8 *)&pPVar3[2].field_0x18 = 0;
  pPVar3[3].size = 0;
  pPVar3[3].destructor = (DestructorFn *)0x0;
  *(undefined2 *)&pPVar3[3].item = 0;
  *(undefined8 *)&pPVar3[3].field_0x18 = 0;
  pPVar3[4].size = 0;
  pPVar3->destructor =
       allocate<soul::AST::EndpointDeclaration,_soul::AST::Context,_bool_&>::anon_class_1_0_00000001
       ::__invoke;
  return (EndpointDeclaration *)&pPVar3->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }